

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderTextureFunctionTests.cpp
# Opt level: O0

void __thiscall
vkt::sr::anon_unknown_0::TextureSamplesInstance::initTexture(TextureSamplesInstance *this)

{
  TextureSpec *pTVar1;
  TestContext *this_00;
  TestLog *this_01;
  MessageBuilder *pMVar2;
  IVec3 *textureSize_00;
  SharedPtr<vkt::sr::TextureBinding> local_1f8;
  string local_1e8;
  MessageBuilder local_1b8;
  undefined1 local_38 [8];
  TextureBindingSp textureBinding;
  IVec3 textureSize;
  TestLog *log;
  TextureSamplesInstance *this_local;
  
  this_00 = Context::getTestContext
                      ((this->super_TextureQueryInstance).super_ShaderRenderCaseInstance.
                       super_TestInstance.m_context);
  this_01 = tcu::TestContext::getLog(this_00);
  pTVar1 = (this->super_TextureQueryInstance).m_textureSpec;
  textureSize_00 = (IVec3 *)(ulong)(uint)pTVar1->depth;
  tcu::Vector<int,_3>::Vector
            ((Vector<int,_3> *)((long)&textureBinding.m_state + 4),pTVar1->width,pTVar1->height,
             pTVar1->depth);
  de::SharedPtr<vkt::sr::TextureBinding>::SharedPtr((SharedPtr<vkt::sr::TextureBinding> *)local_38);
  tcu::TestLog::operator<<(&local_1b8,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar2 = tcu::MessageBuilder::operator<<(&local_1b8,(char (*) [13])"Image size: ");
  sr::(anonymous_namespace)::getTextureSizeString_abi_cxx11_
            (&local_1e8,
             (_anonymous_namespace_ *)
             (ulong)((this->super_TextureQueryInstance).m_textureSpec)->type,
             (int)&textureBinding + 0xc,textureSize_00);
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,&local_1e8);
  tcu::MessageBuilder::operator<<(pMVar2,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::string::~string((string *)&local_1e8);
  tcu::MessageBuilder::~MessageBuilder(&local_1b8);
  pTVar1 = (this->super_TextureQueryInstance).m_textureSpec;
  createEmptyTexture((anon_unknown_0 *)&local_1f8,pTVar1->format,pTVar1->type,
                     (IVec3 *)((long)&textureBinding.m_state + 4),pTVar1->numLevels,0,
                     &pTVar1->sampler);
  de::SharedPtr<vkt::sr::TextureBinding>::operator=
            ((SharedPtr<vkt::sr::TextureBinding> *)local_38,&local_1f8);
  de::SharedPtr<vkt::sr::TextureBinding>::~SharedPtr(&local_1f8);
  std::
  vector<de::SharedPtr<vkt::sr::TextureBinding>,_std::allocator<de::SharedPtr<vkt::sr::TextureBinding>_>_>
  ::push_back(&(this->super_TextureQueryInstance).super_ShaderRenderCaseInstance.m_textures,
              (value_type *)local_38);
  de::SharedPtr<vkt::sr::TextureBinding>::~SharedPtr((SharedPtr<vkt::sr::TextureBinding> *)local_38)
  ;
  return;
}

Assistant:

void TextureSamplesInstance::initTexture (void)
{
	tcu::TestLog&			log					= m_context.getTestContext().getLog();
	tcu::IVec3				textureSize			(m_textureSpec.width, m_textureSpec.height, m_textureSpec.depth);
	TextureBindingSp		textureBinding;

	DE_ASSERT(m_textures.empty());
	DE_ASSERT(m_textureSpec.type == TEXTURETYPE_2D || m_textureSpec.type == TEXTURETYPE_2D_ARRAY);

	log << tcu::TestLog::Message << "Image size: " << getTextureSizeString(m_textureSpec.type, textureSize) << tcu::TestLog::EndMessage;

	textureBinding = createEmptyTexture(m_textureSpec.format, m_textureSpec.type, textureSize, m_textureSpec.numLevels, 0 /* lodBase */, m_textureSpec.sampler);

	m_textures.push_back(textureBinding);
}